

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

string * __thiscall
CLI::Formatter::make_option_opts_abi_cxx11_
          (string *__return_storage_ptr__,Formatter *this,Option *opt)

{
  Option *pOVar1;
  undefined8 uVar2;
  size_t sVar3;
  int iVar4;
  ostream *poVar5;
  _Base_ptr p_Var6;
  string *psVar7;
  stringstream out;
  allocator local_2c1;
  _Rb_tree<CLI::Option_*,_CLI::Option_*,_std::_Identity<CLI::Option_*>,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>
  local_2c0;
  FormatterBase *local_290;
  string *local_288;
  string local_280;
  Option *local_260;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  local_290 = &this->super_FormatterBase;
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  if (opt->type_size_ != 0) {
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>::
    operator()((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2c0,
               &opt->type_name_);
    uVar2 = local_2c0._M_impl.super__Rb_tree_header._M_header._0_8_;
    ::std::__cxx11::string::~string((string *)&local_2c0);
    if (uVar2 != 0) {
      poVar5 = ::std::operator<<(local_1a8," ");
      std::
      function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>::
      operator()(&local_1d8,&opt->type_name_);
      FormatterBase::get_label((string *)&local_2c0,local_290,&local_1d8);
      ::std::operator<<(poVar5,(string *)&local_2c0);
      ::std::__cxx11::string::~string((string *)&local_2c0);
      ::std::__cxx11::string::~string((string *)&local_1d8);
    }
    ::std::__cxx11::string::string((string *)&local_2c0,(string *)&opt->defaultval_);
    uVar2 = local_2c0._M_impl.super__Rb_tree_header._M_header._0_8_;
    ::std::__cxx11::string::~string((string *)&local_2c0);
    if (uVar2 != 0) {
      poVar5 = ::std::operator<<(local_1a8,"=");
      ::std::__cxx11::string::string((string *)&local_2c0,(string *)&opt->defaultval_);
      ::std::operator<<(poVar5,(string *)&local_2c0);
      ::std::__cxx11::string::~string((string *)&local_2c0);
    }
    iVar4 = opt->expected_;
    if (1 < iVar4) {
      poVar5 = ::std::operator<<(local_1a8," x ");
      ::std::ostream::operator<<(poVar5,opt->expected_);
      iVar4 = opt->expected_;
    }
    if (iVar4 == -1) {
      ::std::operator<<(local_1a8," ...");
    }
    if ((opt->super_OptionBase<CLI::Option>).required_ == true) {
      poVar5 = ::std::operator<<(local_1a8," ");
      ::std::__cxx11::string::string((string *)&local_1f8,"REQUIRED",(allocator *)&local_280);
      FormatterBase::get_label((string *)&local_2c0,local_290,&local_1f8);
      ::std::operator<<(poVar5,(string *)&local_2c0);
      ::std::__cxx11::string::~string((string *)&local_2c0);
      ::std::__cxx11::string::~string((string *)&local_1f8);
    }
  }
  ::std::__cxx11::string::string((string *)&local_2c0,(string *)&opt->envname_);
  ::std::__cxx11::string::~string((string *)&local_2c0);
  if (local_2c0._M_impl.super__Rb_tree_header._M_header._0_8_ != 0) {
    poVar5 = ::std::operator<<(local_1a8," (");
    ::std::__cxx11::string::string((string *)&local_218,"Env",&local_2c1);
    FormatterBase::get_label((string *)&local_2c0,local_290,&local_218);
    poVar5 = ::std::operator<<(poVar5,(string *)&local_2c0);
    poVar5 = ::std::operator<<(poVar5,":");
    ::std::__cxx11::string::string((string *)&local_280,(string *)&opt->envname_);
    poVar5 = ::std::operator<<(poVar5,(string *)&local_280);
    ::std::operator<<(poVar5,")");
    ::std::__cxx11::string::~string((string *)&local_280);
    ::std::__cxx11::string::~string((string *)&local_2c0);
    ::std::__cxx11::string::~string((string *)&local_218);
  }
  std::
  _Rb_tree<CLI::Option_*,_CLI::Option_*,_std::_Identity<CLI::Option_*>,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>
  ::_Rb_tree(&local_2c0,&(opt->needs_)._M_t);
  sVar3 = local_2c0._M_impl.super__Rb_tree_header._M_node_count;
  std::
  _Rb_tree<CLI::Option_*,_CLI::Option_*,_std::_Identity<CLI::Option_*>,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>
  ::~_Rb_tree(&local_2c0);
  local_288 = __return_storage_ptr__;
  if (sVar3 != 0) {
    poVar5 = ::std::operator<<(local_1a8," ");
    ::std::__cxx11::string::string((string *)&local_238,"Needs",(allocator *)&local_280);
    FormatterBase::get_label((string *)&local_2c0,local_290,&local_238);
    poVar5 = ::std::operator<<(poVar5,(string *)&local_2c0);
    ::std::operator<<(poVar5,":");
    local_260 = opt;
    ::std::__cxx11::string::~string((string *)&local_2c0);
    ::std::__cxx11::string::~string((string *)&local_238);
    std::
    _Rb_tree<CLI::Option_*,_CLI::Option_*,_std::_Identity<CLI::Option_*>,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>
    ::_Rb_tree(&local_2c0,&(opt->needs_)._M_t);
    for (p_Var6 = local_2c0._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var6 != &local_2c0._M_impl.super__Rb_tree_header;
        p_Var6 = (_Base_ptr)::std::_Rb_tree_increment(p_Var6)) {
      pOVar1 = *(Option **)(p_Var6 + 1);
      poVar5 = ::std::operator<<(local_1a8," ");
      Option::get_name_abi_cxx11_(&local_280,pOVar1,false,false);
      ::std::operator<<(poVar5,(string *)&local_280);
      ::std::__cxx11::string::~string((string *)&local_280);
    }
    std::
    _Rb_tree<CLI::Option_*,_CLI::Option_*,_std::_Identity<CLI::Option_*>,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>
    ::~_Rb_tree(&local_2c0);
    opt = local_260;
  }
  psVar7 = local_288;
  std::
  _Rb_tree<CLI::Option_*,_CLI::Option_*,_std::_Identity<CLI::Option_*>,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>
  ::_Rb_tree(&local_2c0,&(opt->excludes_)._M_t);
  std::
  _Rb_tree<CLI::Option_*,_CLI::Option_*,_std::_Identity<CLI::Option_*>,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>
  ::~_Rb_tree(&local_2c0);
  if (local_2c0._M_impl.super__Rb_tree_header._M_node_count != 0) {
    poVar5 = ::std::operator<<(local_1a8," ");
    ::std::__cxx11::string::string((string *)&local_258,"Excludes",(allocator *)&local_280);
    FormatterBase::get_label((string *)&local_2c0,local_290,&local_258);
    poVar5 = ::std::operator<<(poVar5,(string *)&local_2c0);
    ::std::operator<<(poVar5,":");
    ::std::__cxx11::string::~string((string *)&local_2c0);
    ::std::__cxx11::string::~string((string *)&local_258);
    std::
    _Rb_tree<CLI::Option_*,_CLI::Option_*,_std::_Identity<CLI::Option_*>,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>
    ::_Rb_tree(&local_2c0,&(opt->excludes_)._M_t);
    for (p_Var6 = local_2c0._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var6 != &local_2c0._M_impl.super__Rb_tree_header;
        p_Var6 = (_Base_ptr)::std::_Rb_tree_increment(p_Var6)) {
      pOVar1 = *(Option **)(p_Var6 + 1);
      poVar5 = ::std::operator<<(local_1a8," ");
      Option::get_name_abi_cxx11_(&local_280,pOVar1,false,false);
      ::std::operator<<(poVar5,(string *)&local_280);
      ::std::__cxx11::string::~string((string *)&local_280);
    }
    std::
    _Rb_tree<CLI::Option_*,_CLI::Option_*,_std::_Identity<CLI::Option_*>,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>
    ::~_Rb_tree(&local_2c0);
    psVar7 = local_288;
  }
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  return psVar7;
}

Assistant:

inline std::string Formatter::make_option_opts(const Option *opt) const {
    std::stringstream out;

    if(opt->get_type_size() != 0) {
        if(!opt->get_type_name().empty())
            out << " " << get_label(opt->get_type_name());
        if(!opt->get_defaultval().empty())
            out << "=" << opt->get_defaultval();
        if(opt->get_expected() > 1)
            out << " x " << opt->get_expected();
        if(opt->get_expected() == -1)
            out << " ...";
        if(opt->get_required())
            out << " " << get_label("REQUIRED");
    }
    if(!opt->get_envname().empty())
        out << " (" << get_label("Env") << ":" << opt->get_envname() << ")";
    if(!opt->get_needs().empty()) {
        out << " " << get_label("Needs") << ":";
        for(const Option *op : opt->get_needs())
            out << " " << op->get_name();
    }
    if(!opt->get_excludes().empty()) {
        out << " " << get_label("Excludes") << ":";
        for(const Option *op : opt->get_excludes())
            out << " " << op->get_name();
    }
    return out.str();
}